

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

ostream * Catch::TextFlow::operator<<(ostream *os,Column *col)

{
  pointer pcVar1;
  size_type sVar2;
  bool bVar3;
  string line;
  const_iterator __begin2;
  
  Column::const_iterator::const_iterator(&__begin2,col);
  pcVar1 = (col->m_string).m_string._M_dataplus._M_p;
  sVar2 = (col->m_string).m_string._M_string_length;
  bVar3 = true;
  while ((__begin2.m_lineStart.m_it._M_current != pcVar1 + sVar2 || (__begin2.m_column != col))) {
    Column::const_iterator::operator*[abi_cxx11_(&line,&__begin2);
    if (!bVar3) {
      std::operator<<(os,'\n');
    }
    std::operator<<(os,(string *)&line);
    std::__cxx11::string::~string((string *)&line);
    Column::const_iterator::operator++(&__begin2);
    bVar3 = false;
  }
  return os;
}

Assistant:

std::ostream& operator<<( std::ostream& os, Column const& col ) {
            bool first = true;
            for ( auto line : col ) {
                if ( first ) {
                    first = false;
                } else {
                    os << '\n';
                }
                os << line;
            }
            return os;
        }